

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

xxh_u32 XXH32_finalize(xxh_u32 h32,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  ulong uVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  
  uVar3 = (ulong)((uint)len & 0xc);
  uVar1 = (ulong)((uint)len & 0xf);
  piVar2 = (int *)ptr;
  for (uVar4 = uVar1; 3 < uVar4; uVar4 = uVar4 - 4) {
    uVar5 = *piVar2 * -0x3d4d51c3 + h32;
    piVar2 = piVar2 + 1;
    h32 = (uVar5 * 0x20000 | uVar5 >> 0xf) * 0x27d4eb2f;
  }
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    uVar5 = (uint)ptr[uVar3] * 0x165667b1 + h32;
    h32 = (uVar5 * 0x800 | uVar5 >> 0x15) * -0x61c8864f;
  }
  uVar5 = (h32 >> 0xf ^ h32) * -0x7a143589;
  uVar5 = (uVar5 >> 0xd ^ uVar5) * -0x3d4d51c3;
  return uVar5 >> 0x10 ^ uVar5;
}

Assistant:

static xxh_u32
XXH32_finalize(xxh_u32 h32, const xxh_u8* ptr, size_t len, XXH_alignment align)
{
#define XXH_PROCESS1 do {                           \
    h32 += (*ptr++) * XXH_PRIME32_5;                \
    h32 = XXH_rotl32(h32, 11) * XXH_PRIME32_1;      \
} while (0)

#define XXH_PROCESS4 do {                           \
    h32 += XXH_get32bits(ptr) * XXH_PRIME32_3;      \
    ptr += 4;                                   \
    h32  = XXH_rotl32(h32, 17) * XXH_PRIME32_4;     \
} while (0)

    /* Compact rerolled version */
    if (XXH_REROLL) {
        len &= 15;
        while (len >= 4) {
            XXH_PROCESS4;
            len -= 4;
        }
        while (len > 0) {
            XXH_PROCESS1;
            --len;
        }
        return XXH32_avalanche(h32);
    } else {
         switch(len&15) /* or switch(bEnd - p) */ {
           case 12:      XXH_PROCESS4;
                         /* fallthrough */
           case 8:       XXH_PROCESS4;
                         /* fallthrough */
           case 4:       XXH_PROCESS4;
                         return XXH32_avalanche(h32);

           case 13:      XXH_PROCESS4;
                         /* fallthrough */
           case 9:       XXH_PROCESS4;
                         /* fallthrough */
           case 5:       XXH_PROCESS4;
                         XXH_PROCESS1;
                         return XXH32_avalanche(h32);

           case 14:      XXH_PROCESS4;
                         /* fallthrough */
           case 10:      XXH_PROCESS4;
                         /* fallthrough */
           case 6:       XXH_PROCESS4;
                         XXH_PROCESS1;
                         XXH_PROCESS1;
                         return XXH32_avalanche(h32);

           case 15:      XXH_PROCESS4;
                         /* fallthrough */
           case 11:      XXH_PROCESS4;
                         /* fallthrough */
           case 7:       XXH_PROCESS4;
                         /* fallthrough */
           case 3:       XXH_PROCESS1;
                         /* fallthrough */
           case 2:       XXH_PROCESS1;
                         /* fallthrough */
           case 1:       XXH_PROCESS1;
                         /* fallthrough */
           case 0:       return XXH32_avalanche(h32);
        }
        XXH_ASSERT(0);
        return h32;   /* reaching this point is deemed impossible */
    }
}